

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaCheckFacetValues(xmlSchemaTypePtr typeDecl,xmlSchemaParserCtxtPtr pctxt)

{
  int iVar1;
  void *pvVar2;
  xmlSchemaValidityErrorFunc err;
  xmlSchemaValidityWarningFunc warn;
  xmlSchemaValidCtxtPtr pxVar3;
  xmlStructuredErrorFunc serror;
  int iVar4;
  xmlSchemaValidCtxtPtr pxVar5;
  char *in_R8;
  int in_R9D;
  xmlSchemaFacetPtr facet;
  xmlSchemaFacetPtr facet_00;
  int in_stack_ffffffffffffffb0;
  
  iVar1 = pctxt->nberrors;
  facet_00 = typeDecl->facets;
  if (facet_00 != (xmlSchemaFacetPtr)0x0) {
    if (pctxt->vctxt == (xmlSchemaValidCtxtPtr)0x0) {
      pxVar5 = xmlSchemaNewValidCtxt((xmlSchemaPtr)0x0);
      pctxt->vctxt = pxVar5;
      if (pxVar5 == (xmlSchemaValidCtxtPtr)0x0) {
        xmlSchemaPErrFull(pctxt,(xmlNodePtr)0x0,0xbfd,XML_ERR_ERROR,in_R8,in_R9D,(xmlChar *)0x0,
                          (xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffffb0,
                          "Internal error: xmlSchemaCreateVCtxtOnPCtxt, failed to create a temp. validation context.\n"
                          ,0,0);
      }
      else {
        pvVar2 = pctxt->errCtxt;
        err = pctxt->error;
        warn = pctxt->warning;
        pxVar5->error = err;
        pxVar5->warning = warn;
        pxVar5->errCtxt = pvVar2;
        if (pxVar5->pctxt != (xmlSchemaParserCtxtPtr)0x0) {
          xmlSchemaSetParserErrors(pxVar5->pctxt,err,warn,pvVar2);
        }
        pxVar3 = pctxt->vctxt;
        if (pxVar3 != (xmlSchemaValidCtxtPtr)0x0) {
          pvVar2 = pctxt->errCtxt;
          serror = pctxt->serror;
          pxVar3->serror = serror;
          pxVar3->error = (xmlSchemaValidityErrorFunc)0x0;
          pxVar3->warning = (xmlSchemaValidityWarningFunc)0x0;
          pxVar3->errCtxt = pvVar2;
          if (pxVar3->pctxt != (xmlSchemaParserCtxtPtr)0x0) {
            xmlSchemaSetParserStructuredErrors(pxVar3->pctxt,serror,pvVar2);
          }
        }
      }
      if (pxVar5 == (xmlSchemaValidCtxtPtr)0x0) {
        return -1;
      }
    }
    pxVar5 = pctxt->vctxt;
    pxVar5->schema = pctxt->schema;
    do {
      iVar4 = xmlSchemaCheckFacet(facet_00,typeDecl,pctxt,(xmlChar *)pxVar5);
      if (iVar4 == -1) {
        return -1;
      }
      facet_00 = facet_00->next;
    } while (facet_00 != (_xmlSchemaFacet *)0x0);
    pctxt->vctxt->schema = (xmlSchemaPtr)0x0;
  }
  iVar4 = 0;
  if (iVar1 != pctxt->nberrors) {
    iVar4 = pctxt->err;
  }
  return iVar4;
}

Assistant:

static int
xmlSchemaCheckFacetValues(xmlSchemaTypePtr typeDecl,
			  xmlSchemaParserCtxtPtr pctxt)
{
    int res, olderrs = pctxt->nberrors;
    const xmlChar *name = typeDecl->name;
    /*
    * NOTE: It is intended to use the facets list, instead
    * of facetSet.
    */
    if (typeDecl->facets != NULL) {
	xmlSchemaFacetPtr facet = typeDecl->facets;

	/*
	* Temporarily assign the "schema" to the validation context
	* of the parser context. This is needed for NOTATION validation.
	*/
	if (pctxt->vctxt == NULL) {
	    if (xmlSchemaCreateVCtxtOnPCtxt(pctxt) == -1)
		return(-1);
	}
	pctxt->vctxt->schema = pctxt->schema;
	while (facet != NULL) {
	    res = xmlSchemaCheckFacet(facet, typeDecl, pctxt, name);
	    HFAILURE
	    facet = facet->next;
	}
	pctxt->vctxt->schema = NULL;
    }
    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    return(0);
exit_failure:
    return(-1);
}